

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_kill_bb(dmr_C *C,basic_block *bb)

{
  undefined1 local_78 [8];
  ptr_list_iter parentiter__;
  ptr_list_iter childiter__;
  ptr_list_iter insniter__;
  basic_block *parent;
  basic_block *child;
  instruction *insn;
  basic_block *bb_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)&childiter__.__nr,(ptr_list *)bb->insns);
  child = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&childiter__.__nr);
  while (child != (basic_block *)0x0) {
    dmrC_kill_instruction_force(C,(instruction *)child);
    kill_defs(C,(instruction *)child);
    child = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&childiter__.__nr);
  }
  bb->insns = (instruction_list *)0x0;
  ptrlist_forward_iterator((ptr_list_iter *)&parentiter__.__nr,(ptr_list *)bb->children);
  parent = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&parentiter__.__nr);
  while (parent != (basic_block *)0x0) {
    dmrC_remove_bb_from_list(&parent->parents,bb,0);
    parent = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&parentiter__.__nr);
  }
  bb->children = (basic_block_list *)0x0;
  ptrlist_forward_iterator((ptr_list_iter *)local_78,(ptr_list *)bb->parents);
  insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_78);
  while (insniter__._16_8_ != 0) {
    dmrC_remove_bb_from_list((basic_block_list **)(insniter__._16_8_ + 0x28),bb,0);
    insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_78);
  }
  bb->parents = (basic_block_list *)0x0;
  return;
}

Assistant:

void dmrC_kill_bb(struct dmr_C *C, struct basic_block *bb)
{
	struct instruction *insn;
	struct basic_block *child, *parent;

	FOR_EACH_PTR(bb->insns, insn) {
		dmrC_kill_instruction_force(C, insn);
		kill_defs(C, insn);
		/*
		 * We kill unreachable instructions even if they
		 * otherwise aren't "killable" (e.g. volatile loads)
		 */
	} END_FOR_EACH_PTR(insn);
	bb->insns = NULL;

	FOR_EACH_PTR(bb->children, child) {
		dmrC_remove_bb_from_list(&child->parents, bb, 0);
	} END_FOR_EACH_PTR(child);
	bb->children = NULL;

	FOR_EACH_PTR(bb->parents, parent) {
		dmrC_remove_bb_from_list(&parent->children, bb, 0);
	} END_FOR_EACH_PTR(parent);
	bb->parents = NULL;
}